

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

transformations_t *
opengv::absolute_pose::gp3p
          (transformations_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  transformations_t *solutions;
  rotation_t R;
  Matrix3d p;
  Matrix3d v;
  Matrix3d f;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  double local_188;
  double dStack_180;
  double local_178;
  undefined1 local_170 [16];
  double local_160;
  undefined1 local_158 [16];
  double local_148;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118 [2];
  Matrix3d local_108;
  Matrix3d local_c0;
  Matrix3d local_78;
  
  lVar5 = 0x10;
  lVar4 = 0;
  do {
    (*adapter->_vptr_AbsoluteAdapterBase[2])
              (&local_188,adapter,
               (long)*(int *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar4));
    dVar3 = local_188;
    local_138 = local_188;
    dStack_130 = local_188;
    local_128 = dStack_180;
    dStack_120 = dStack_180;
    local_118[0] = local_178;
    local_118[1] = local_178;
    (*adapter->_vptr_AbsoluteAdapterBase[5])
              (&local_188,adapter,
               (long)*(int *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar4));
    auVar1._8_8_ = dStack_120;
    auVar1._0_8_ = local_128;
    auVar2._8_8_ = local_118[1];
    auVar2._0_8_ = local_118[0];
    auVar6._0_8_ = local_138 * local_188;
    auVar6._8_8_ = dStack_130 * dStack_180;
    auVar1 = vfmadd231pd_fma(auVar6,auVar1,local_170);
    auVar1 = vfmadd231pd_fma(auVar1,auVar2,local_158);
    *(undefined1 (*) [16])
     ((long)local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5 + 0x38) = auVar1;
    *(double *)
     ((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5) = dVar3 * local_178 + local_128 * local_160 + local_118[0] * local_148;
    (*adapter->_vptr_AbsoluteAdapterBase[4])
              (&local_1a8,adapter,
               (long)*(int *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar4));
    *(undefined8 *)
     ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5 + 0x38) = local_1a8;
    *(undefined8 *)
     ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5 + 0x40) = uStack_1a0;
    *(undefined8 *)
     ((long)local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5) = local_198;
    (*adapter->_vptr_AbsoluteAdapterBase[6])
              (&local_1a8,adapter,
               (long)*(int *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + 4;
    *(undefined8 *)((long)local_118 + lVar5) = local_1a8;
    *(undefined8 *)
     ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5 + -8) = uStack_1a0;
    *(undefined8 *)
     ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar5) = local_198;
    lVar5 = lVar5 + 0x18;
  } while (lVar4 != 0xc);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  modules::gp3p_main(&local_78,&local_c0,&local_108,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::gp3p(
    const AbsoluteAdapterBase & adapter,
    const std::vector<int> & indices )
{
  assert(indices.size()>2);

  Eigen::Matrix3d f;
  Eigen::Matrix3d v;
  Eigen::Matrix3d p;

  for(size_t i = 0; i < 3; i++)
  {
    f.col(i) = adapter.getBearingVector(indices[i]);
    rotation_t R = adapter.getCamRotation(indices[i]);
    
    //unrotate the bearingVectors already so the camera rotation doesn't appear
    //in the problem
    f.col(i) = R * f.col(i);
    v.col(i) = adapter.getCamOffset(indices[i]);
    p.col(i) = adapter.getPoint(indices[i]);
  }

  transformations_t solutions;
  modules::gp3p_main(f,v,p,solutions);

  return solutions;
}